

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  ImDrawVert *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImDrawVert *vert;
  ImDrawVert *pIVar4;
  uint uVar5;
  uint uVar6;
  undefined8 in_XMM0_Qb;
  float fVar7;
  undefined1 in_register_00001248 [56];
  undefined1 auVar8 [64];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  
  auVar8._8_56_ = in_register_00001248;
  auVar8._0_8_ = gradient_p1;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = gradient_p0;
  auVar3 = vsubps_avx(auVar8._0_16_,auVar2);
  auVar11._8_8_ = in_XMM0_Qb;
  auVar11._0_8_ = gradient_p0;
  auVar2 = vmovshdup_avx(auVar11);
  auVar11 = vmovshdup_avx(auVar3);
  fVar9 = auVar11._0_4_;
  fVar7 = auVar3._0_4_;
  pIVar1 = (draw_list->VtxBuffer).Data;
  uVar6 = col0 >> 8 & 0xff;
  uVar5 = col0 >> 0x10 & 0xff;
  for (pIVar4 = pIVar1 + vert_start_idx; pIVar4 < pIVar1 + vert_end_idx; pIVar4 = pIVar4 + 1) {
    auVar11 = ZEXT416((uint)((((pIVar4->pos).x - gradient_p0.x) * fVar7 +
                             ((pIVar4->pos).y - auVar2._0_4_) * fVar9) *
                            (1.0 / (fVar7 * fVar7 + fVar9 * fVar9))));
    auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
    auVar11 = vcmpss_avx(auVar11,ZEXT816(0) << 0x40,1);
    auVar11 = vandnps_avx(auVar11,auVar3);
    fVar10 = auVar11._0_4_;
    pIVar4->col = (uint)*(byte *)((long)&pIVar4->col + 3) << 0x18 |
                  (int)(fVar10 * (float)(int)((col1 & 0xff) - (col0 & 0xff)) + (float)(col0 & 0xff))
                  | (int)((float)(int)((col1 >> 8 & 0xff) - uVar6) * fVar10 + (float)uVar6) << 8 |
                  (int)((float)(int)((col1 >> 0x10 & 0xff) - uVar5) * fVar10 + (float)uVar5) << 0x10
    ;
  }
  return;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x - rhs.x, lhs.y - rhs.y); }